

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

ParsedParameter * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::ParsedParameter,pstd::pmr::polymorphic_allocator<std::byte>&,pbrt::FileLoc&>
          (polymorphic_allocator<std::byte> *this,polymorphic_allocator<std::byte> *args,
          FileLoc *args_1)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0xd0,8);
  pbrt::ParsedParameter::ParsedParameter
            ((ParsedParameter *)CONCAT44(extraout_var,iVar1),args->memoryResource,*args_1);
  return (ParsedParameter *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }